

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.h
# Opt level: O0

CreatePegoutAddressRequest * __thiscall
cfd::js::api::json::CreatePegoutAddressRequest::GetNetworkString_abi_cxx11_
          (CreatePegoutAddressRequest *this,CreatePegoutAddressRequest *obj)

{
  CreatePegoutAddressRequest *obj_local;
  
  core::ConvertToString<std::__cxx11::string>((core *)this,&obj->network_);
  return this;
}

Assistant:

static std::string GetNetworkString(  // line separate
      const CreatePegoutAddressRequest& obj) {  // NOLINT
    return cfd::core::ConvertToString(obj.network_);
  }